

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_2::ImageAtomicOpCase::init
          (ImageAtomicOpCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  RenderContext *pRVar3;
  undefined7 extraout_var;
  ContextInfo *this_00;
  undefined7 extraout_var_00;
  NotSupportedError *this_01;
  allocator<char> local_39;
  string local_38;
  deUint32 local_18;
  ContextType local_14;
  ImageAtomicOpCase *local_10;
  ImageAtomicOpCase *this_local;
  int iVar2;
  
  local_10 = this;
  pRVar3 = Context::getRenderContext((this->super_TestCase).m_context);
  local_14.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  local_18 = (deUint32)glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(local_14,(ApiType)local_18);
  iVar2 = (int)CONCAT71(extraout_var,bVar1);
  if (!bVar1) {
    this_00 = Context::getContextInfo((this->super_TestCase).m_context);
    bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_OES_shader_image_atomic");
    iVar2 = (int)CONCAT71(extraout_var_00,bVar1);
    if (!bVar1) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Test requires OES_shader_image_atomic extension",&local_39);
      tcu::NotSupportedError::NotSupportedError(this_01,&local_38);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  return iVar2;
}

Assistant:

void init (void)
	{
		if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)))
			if (!m_context.getContextInfo().isExtensionSupported("GL_OES_shader_image_atomic"))
				throw tcu::NotSupportedError("Test requires OES_shader_image_atomic extension");
	}